

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O3

short __thiscall MP1Node::getPortFromAddress(MP1Node *this,string *address)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  char *local_50;
  char *local_48 [2];
  char local_38 [16];
  
  std::__cxx11::string::find((char *)address,0x1070b8,0);
  std::__cxx11::string::substr((ulong)local_48,(ulong)address);
  __nptr = local_48[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_50,10);
  if (local_50 == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*piVar2 != 0x22)) {
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
    return (short)lVar3;
  }
  uVar4 = std::__throw_out_of_range("stoi");
  if (*piVar2 == 0) {
    *piVar2 = iVar1;
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

short MP1Node::getPortFromAddress(string address) {
    size_t pos = address.find(":");
    short port = (short)stoi(address.substr(pos + 1, address.size()-pos-1));
    return port;
}